

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O2

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  MESSAGE_RECEIVER_STATE MStack_8;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if (*(int *)((long)context + 0x18) - 3U < 2) {
      MStack_8 = MESSAGE_RECEIVER_STATE_IDLE;
      goto LAB_0012aebe;
    }
    if (*(int *)((long)context + 0x18) == 1) {
      return;
    }
  }
  else {
    if (new_link_state != LINK_STATE_ERROR) {
      if ((new_link_state != LINK_STATE_ATTACHED) || (*(int *)((long)context + 0x18) != 2)) {
        return;
      }
      MStack_8 = MESSAGE_RECEIVER_STATE_OPEN;
      goto LAB_0012aebe;
    }
    if (*(int *)((long)context + 0x18) == 5) {
      return;
    }
  }
  MStack_8 = MESSAGE_RECEIVER_STATE_ERROR;
LAB_0012aebe:
  set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MStack_8);
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPENING)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN) ||
            (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_CLOSING))
        {
            /* User initiated transition, we should be good */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_IDLE);
        }
        else if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_ERROR)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    }
}